

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O1

int fmt::v8::detail::format_float<double>
              (double value,int precision,float_specs specs,buffer<char> *buf)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  uint64_t divisor;
  uint uVar3;
  result rVar4;
  round_direction rVar5;
  detail *pdVar6;
  decimal_fp<float> dVar7;
  format_error *this;
  byte bVar8;
  undefined1 is_predecessor_closer;
  uint uVar9;
  long lVar10;
  ulong uVar11;
  int iVar12;
  uint64_t error;
  char cVar13;
  uint uVar14;
  ulong uVar15;
  ulong uVar16;
  int iVar17;
  size_t sVar18;
  buffer<char> *pbVar19;
  ulong uVar20;
  bool bVar21;
  bool bVar22;
  undefined4 uVar23;
  float fVar24;
  undefined4 uVar25;
  fp value_00;
  decimal_fp<double> dVar26;
  int exp;
  gen_digits_handler handler;
  int *in_stack_ffffffffffffff58;
  undefined1 local_9c [12];
  int local_90;
  int local_8c;
  int local_88;
  undefined1 local_84;
  double local_80;
  ulong local_78;
  uint64_t local_70;
  uint local_64;
  buffer<char> *local_60;
  ulong local_58;
  detail *local_50;
  double local_48;
  ulong local_40;
  ulong local_38;
  
  if (value < 0.0) {
    assert_fail("/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/external/fmt/include/fmt/format-inl.h"
                ,0x929,"value is negative");
  }
  uVar15 = (ulong)(uint)precision;
  uVar16 = (ulong)specs & 0xff00000000;
  bVar21 = uVar16 == 0x200000000;
  if (value <= 0.0) {
    if (precision < 1 || uVar16 != 0x200000000) {
      if (buf->capacity_ < buf->size_ + 1) {
        (**buf->_vptr_buffer)(buf);
      }
      sVar18 = buf->size_;
      buf->size_ = sVar18 + 1;
      buf->ptr_[sVar18] = '0';
      return 0;
    }
    uVar16 = (ulong)(uint)precision;
    if (buf->capacity_ < uVar16) {
      (**buf->_vptr_buffer)(buf,uVar16);
    }
    uVar15 = buf->capacity_;
    if (uVar16 <= buf->capacity_) {
      uVar15 = uVar16;
    }
    buf->size_ = uVar15;
    if (-1 < precision) {
      memset(buf->ptr_,0x30,uVar16);
      return -precision;
    }
    goto LAB_00111008;
  }
  local_38 = (ulong)specs >> 0x20;
  if ((specs._4_4_ >> 0x13 & 1) != 0) {
    iVar12 = snprintf_float<double>(value,precision,specs,buf);
    return iVar12;
  }
  if (precision < 0) {
    if ((specs._4_4_ >> 0x12 & 1) == 0) {
      dVar26 = dragonbox::to_decimal<double>(value);
      write<char,_fmt::v8::appender,_unsigned_long,_0>((appender)buf,dVar26.significand);
      return dVar26.exponent;
    }
    dVar7 = dragonbox::to_decimal<float>((float)value);
    write<char,_fmt::v8::appender,_unsigned_int,_0>((appender)buf,dVar7.significand);
    return dVar7.exponent;
  }
  local_9c._0_4_ = 0;
  local_50 = (detail *)((ulong)value & 0xfffffffffffff);
  bVar22 = (ulong)value >> 0x34 == 0;
  pdVar6 = (detail *)((ulong)local_50 | 0x10000000000000);
  if (bVar22) {
    pdVar6 = local_50;
  }
  local_64 = (uint)((ulong)value >> 0x34) - 0x433;
  uVar14 = local_64;
  if (bVar22) {
    lVar10 = 0x3f;
    if (local_50 != (detail *)0x0) {
      for (; (ulong)local_50 >> lVar10 == 0; lVar10 = lVar10 + -1) {
      }
    }
    pdVar6 = (detail *)((long)pdVar6 << (~(byte)lVar10 + 0x35 & 0x3f));
    uVar14 = 0xfffffbd9 - ((uint)lVar10 ^ 0x3f);
  }
  iVar12 = (int)((ulong)((long)(int)(-0x32 - uVar14) * 0x4d104d42 + 0xffffffff) >> 0x20);
  uVar9 = iVar12 + 0x15b;
  uVar3 = iVar12 + 0x162;
  if (-1 < (int)uVar9) {
    uVar3 = uVar9;
  }
  local_40 = (ulong)(uVar3 & 0xfffffff8);
  auVar1._8_8_ = 0;
  auVar1._0_8_ = (long)pdVar6 << 0xb;
  auVar2._8_8_ = 0;
  auVar2._0_8_ = basic_impl_data<void>::pow10_significands[(long)((int)uVar3 >> 3) + 1];
  uVar20 = SUB168(auVar1 * auVar2,8) - (SUB168(auVar1 * auVar2,0) >> 0x3f);
  bVar8 = -((char)basic_impl_data<void>::pow10_exponents[(long)((int)uVar3 >> 3) + 1] + (char)uVar14
           ) - 0x35;
  local_9c._4_8_ = buf->ptr_;
  local_90 = 0;
  local_88 = 0x154 - (uVar3 & 0xfffffff8);
  local_70 = 1L << (bVar8 & 0x3f);
  uVar11 = uVar20 >> (bVar8 & 0x3f);
  local_8c = precision;
  local_84 = bVar21;
  local_48 = value;
  if ((uint)uVar11 == 0) {
    assert_fail("/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/external/fmt/include/fmt/format-inl.h"
                ,0x2ba,"");
  }
  local_80 = value;
  local_60 = buf;
  local_58 = uVar15;
  if (uVar11 >> 0x20 != 0) {
    assert_fail("/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/external/fmt/include/fmt/format-inl.h"
                ,699,"");
  }
  uVar3 = (uint)uVar11 | 1;
  uVar14 = 0x1f;
  if (uVar3 != 0) {
    for (; uVar3 >> uVar14 == 0; uVar14 = uVar14 - 1) {
    }
  }
  local_9c._0_4_ =
       (undefined4)
       (uVar11 + *(long *)(do_count_digits(unsigned_int)::table + (ulong)uVar14 * 8) >> 0x20);
  pbVar19 = buf;
  local_78 = uVar16;
  if (uVar16 == 0x200000000) {
    uVar3 = local_88 + local_9c._0_4_;
    if ((int)(uVar3 ^ 0x7fffffff) < precision && 0 < (int)uVar3) {
      this = (format_error *)__cxa_allocate_exception(0x10);
      format_error::format_error(this,"number is too big");
      __cxa_throw(this,&format_error::typeinfo,format_error::~format_error);
    }
    iVar12 = uVar3 + precision;
    local_8c = iVar12;
    if ((iVar12 == 0 || SCARRY4(uVar3,precision) != iVar12 < 0) &&
       (pbVar19 = (buffer<char> *)0x1, iVar12 >= 0)) {
      rVar5 = get_round_direction(basic_impl_data<void>::power_of_10_64
                                  [(long)(uVar11 + *(long *)(do_count_digits(unsigned_int)::table +
                                                            (ulong)uVar14 * 8) + -0x100000000) >>
                                   0x20] << (bVar8 & 0x3f),uVar20 / 10,10);
      if (rVar5 == unknown) {
        pbVar19 = (buffer<char> *)0x2;
      }
      else {
        lVar10 = (long)local_90;
        local_90 = local_90 + 1;
        *(byte *)(local_9c._4_8_ + lVar10) = rVar5 == up | 0x30;
      }
    }
    iVar17 = (int)pbVar19;
    if (0 < iVar12) goto LAB_00110b13;
  }
  else {
LAB_00110b13:
    uVar16 = local_70 - 1;
    uVar20 = uVar20 & uVar16;
    do {
      lVar10 = (long)(int)local_9c._0_4_;
      switch(local_9c._0_4_) {
      case 1:
        cVar13 = (char)uVar11;
        uVar11 = 0;
        goto LAB_00110c12;
      case 2:
        cVar13 = (char)((uVar11 & 0xffffffff) / 10);
        iVar12 = (int)((uVar11 & 0xffffffff) / 10) * 10;
        break;
      case 3:
        cVar13 = (char)((uVar11 & 0xffffffff) / 100);
        iVar12 = (int)((uVar11 & 0xffffffff) / 100) * 100;
        break;
      case 4:
        cVar13 = (char)((uVar11 & 0xffffffff) / 1000);
        iVar12 = (int)((uVar11 & 0xffffffff) / 1000) * 1000;
        break;
      case 5:
        cVar13 = (char)((uVar11 & 0xffffffff) / 10000);
        iVar12 = (int)((uVar11 & 0xffffffff) / 10000) * 10000;
        break;
      case 6:
        uVar15 = uVar11 >> 5 & 0x7ffffff;
        cVar13 = (char)(uVar15 / 0xc35);
        iVar12 = (int)(uVar15 / 0xc35) * 100000;
        break;
      case 7:
        cVar13 = (char)((uVar11 & 0xffffffff) / 1000000);
        iVar12 = (int)((uVar11 & 0xffffffff) / 1000000) * 1000000;
        break;
      case 8:
        cVar13 = (char)((uVar11 & 0xffffffff) / 10000000);
        iVar12 = (int)((uVar11 & 0xffffffff) / 10000000) * 10000000;
        break;
      case 9:
        cVar13 = (char)((uVar11 & 0xffffffff) / 100000000);
        iVar12 = (int)((uVar11 & 0xffffffff) / 100000000) * 100000000;
        break;
      case 10:
        uVar15 = (uVar11 >> 9 & 0x7fffff) * 0x44b83;
        cVar13 = (char)(uVar15 >> 0x27);
        iVar12 = (uint)(uVar15 >> 0x27) * 1000000000;
        break;
      default:
        assert_fail("/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/external/fmt/include/fmt/format-inl.h"
                    ,0x2ff,"invalid number of digits");
      }
      uVar11 = (ulong)(uint)((int)uVar11 - iVar12);
LAB_00110c12:
      local_9c._0_4_ = local_9c._0_4_ + -1;
      rVar4 = gen_digits_handler::on_digit
                        ((gen_digits_handler *)(local_9c + 4),cVar13 + '0',
                         *(long *)(basic_impl_data<void>::pow10_exponents + lVar10 * 4 + 0x54) <<
                         (bVar8 & 0x3f),(uVar11 << (bVar8 & 0x3f)) + uVar20,1,true);
      divisor = local_70;
      pbVar19 = (buffer<char> *)((ulong)pbVar19 & 0xffffffff);
      if (rVar4 != more) {
        pbVar19 = (buffer<char> *)(ulong)rVar4;
      }
      iVar17 = (int)pbVar19;
      if (rVar4 != more) goto LAB_00110cba;
    } while (0 < (int)local_9c._0_4_);
    error = 1;
    do {
      uVar15 = uVar20 * 10;
      error = error * 10;
      uVar20 = uVar15 & uVar16;
      local_9c._0_4_ = local_9c._0_4_ + -1;
      rVar4 = gen_digits_handler::on_digit
                        ((gen_digits_handler *)(local_9c + 4),(char)(uVar15 >> (bVar8 & 0x3f)) + '0'
                         ,divisor,uVar20,error,false);
      if (rVar4 != more) {
        pbVar19 = (buffer<char> *)(ulong)rVar4;
      }
      iVar17 = (int)pbVar19;
    } while (rVar4 == more);
  }
LAB_00110cba:
  pbVar19 = local_60;
  uVar23 = SUB84(local_80,0);
  uVar25 = (undefined4)((ulong)local_80 >> 0x20);
  if (iVar17 == 2) {
    local_9c._0_4_ = local_9c._0_4_ + (local_90 - ((int)local_40 + 8)) + 0x15b;
    iVar12 = local_8c;
  }
  else {
    local_9c._0_4_ = local_9c._0_4_ + local_88;
    uVar16 = (ulong)local_90;
    if ((long)uVar16 < 0) {
LAB_00111008:
      assert_fail("/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/external/fmt/include/fmt/core.h"
                  ,0x195,"negative value");
    }
    iVar12 = (int)local_58;
    if (local_60->capacity_ < uVar16) {
      (**local_60->_vptr_buffer)(local_60,uVar16);
      uVar23 = SUB84(local_80,0);
      uVar25 = (undefined4)((ulong)local_80 >> 0x20);
    }
    if (pbVar19->capacity_ < uVar16) {
      uVar16 = pbVar19->capacity_;
    }
    pbVar19->size_ = uVar16;
  }
  uVar14 = (uint)local_38;
  if (iVar17 == 2) {
    if ((uVar14 >> 0x12 & 1) == 0) {
      pdVar6 = (detail *)((ulong)local_50 | 0x10000000000000);
      if ((ulong)local_48 < 0x10000000000000) {
        pdVar6 = local_50;
      }
      uVar3 = local_64;
      if ((ulong)local_48 < 0x10000000000000) {
        uVar3 = 0xfffffbce;
      }
      uVar16 = (ulong)uVar3;
      bVar22 = local_50 == (detail *)0x0;
      bVar21 = (ulong)local_48 >> 0x35 != 0;
    }
    else {
      fVar24 = (float)(double)CONCAT44(uVar25,uVar23);
      uVar3 = (uint)fVar24 & 0x7fffff;
      pdVar6 = (detail *)(ulong)uVar3 + 0x800000;
      if ((uint)fVar24 < 0x800000) {
        pdVar6 = (detail *)(ulong)uVar3;
      }
      uVar16 = 0xffffff6b;
      if ((uint)fVar24 >= 0x800000) {
        uVar16 = (ulong)(((uint)fVar24 >> 0x17) - 0x96);
      }
      bVar22 = uVar3 == 0;
      bVar21 = 0xffffff < (uint)fVar24;
    }
    is_predecessor_closer = 0xff;
    if (iVar12 < 0x2ff) {
      is_predecessor_closer = (undefined1)iVar12;
    }
    value_00.e._0_1_ = bVar21 & bVar22;
    value_00.f = uVar16;
    value_00._9_7_ = 0;
    format_dragon(pdVar6,value_00,(bool)is_predecessor_closer,(int)pbVar19,(buffer<char> *)local_9c,
                  in_stack_ffffffffffffff58);
  }
  if ((uVar14 >> 0x14 & 1) == 0 && local_78 != 0x200000000) {
    sVar18 = pbVar19->size_;
    if (sVar18 != 0) {
      do {
        iVar12 = local_9c._0_4_ + 1;
        if (pbVar19->ptr_[sVar18 - 1] != '0') goto LAB_00110f3a;
        sVar18 = sVar18 - 1;
        local_9c._0_4_ = iVar12;
      } while (sVar18 != 0);
      sVar18 = 0;
    }
LAB_00110f3a:
    if (pbVar19->capacity_ < sVar18) {
      (**pbVar19->_vptr_buffer)(pbVar19,sVar18);
    }
    if (pbVar19->capacity_ < sVar18) {
      sVar18 = pbVar19->capacity_;
    }
    pbVar19->size_ = sVar18;
  }
  return local_9c._0_4_;
}

Assistant:

FMT_HEADER_ONLY_CONSTEXPR20 int format_float(Float value, int precision,
                                             float_specs specs,
                                             buffer<char>& buf) {
  // float is passed as double to reduce the number of instantiations.
  static_assert(!std::is_same<Float, float>::value, "");
  FMT_ASSERT(value >= 0, "value is negative");

  const bool fixed = specs.format == float_format::fixed;
  if (value <= 0) {  // <= instead of == to silence a warning.
    if (precision <= 0 || !fixed) {
      buf.push_back('0');
      return 0;
    }
    buf.try_resize(to_unsigned(precision));
    fill_n(buf.data(), precision, '0');
    return -precision;
  }

  if (specs.fallback) return snprintf_float(value, precision, specs, buf);

  if (!is_constant_evaluated() && precision < 0) {
    // Use Dragonbox for the shortest format.
    if (specs.binary32) {
      auto dec = dragonbox::to_decimal(static_cast<float>(value));
      write<char>(buffer_appender<char>(buf), dec.significand);
      return dec.exponent;
    }
    auto dec = dragonbox::to_decimal(static_cast<double>(value));
    write<char>(buffer_appender<char>(buf), dec.significand);
    return dec.exponent;
  }

  int exp = 0;
  bool use_dragon = true;
  if (is_fast_float<Float>()) {
    // Use Grisu + Dragon4 for the given precision:
    // https://www.cs.tufts.edu/~nr/cs257/archive/florian-loitsch/printf.pdf.
    const int min_exp = -60;  // alpha in Grisu.
    int cached_exp10 = 0;     // K in Grisu.
    fp normalized = normalize(fp(value));
    const auto cached_pow = get_cached_power(
        min_exp - (normalized.e + fp::num_significand_bits), cached_exp10);
    normalized = normalized * cached_pow;
    gen_digits_handler handler{buf.data(), 0, precision, -cached_exp10, fixed};
    if (grisu_gen_digits(normalized, 1, exp, handler) != digits::error &&
        !is_constant_evaluated()) {
      exp += handler.exp10;
      buf.try_resize(to_unsigned(handler.size));
      use_dragon = false;
    } else {
      exp += handler.size - cached_exp10 - 1;
      precision = handler.precision;
    }
  }
  if (use_dragon) {
    auto f = fp();
    bool is_predecessor_closer =
        specs.binary32 ? f.assign(static_cast<float>(value)) : f.assign(value);
    // Limit precision to the maximum possible number of significant digits in
    // an IEEE754 double because we don't need to generate zeros.
    const int max_double_digits = 767;
    if (precision > max_double_digits) precision = max_double_digits;
    format_dragon(f, is_predecessor_closer, precision, buf, exp);
  }
  if (!fixed && !specs.showpoint) {
    // Remove trailing zeros.
    auto num_digits = buf.size();
    while (num_digits > 0 && buf[num_digits - 1] == '0') {
      --num_digits;
      ++exp;
    }
    buf.try_resize(num_digits);
  }
  return exp;
}